

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O2

void __thiscall
references::scheme::environment::environment
          (environment *this,cells *parms,cells *args,environment *outer)

{
  _Rb_tree_header *p_Var1;
  mapped_type *this_00;
  pointer pcVar2;
  pointer pcVar3;
  
  p_Var1 = &(this->env_)._M_t._M_impl.super__Rb_tree_header;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->env_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->outer_ = outer;
  pcVar3 = (args->
           super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>).
           _M_impl.super__Vector_impl_data._M_start;
  for (pcVar2 = (parms->
                super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pcVar2 != (parms->
                super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>
                )._M_impl.super__Vector_impl_data._M_finish; pcVar2 = pcVar2 + 1) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
              ::operator[](&this->env_,&pcVar2->val);
    cell::operator=(this_00,pcVar3);
    pcVar3 = pcVar3 + 1;
  }
  return;
}

Assistant:

environment(const cells & parms, const cells & args, environment * outer)
		: outer_(outer)
	{
		cellit a = args.begin();
		for (cellit p = parms.begin(); p != parms.end(); ++p)
			env_[p->val] = *a++;
	}